

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O3

int ffgbytoff(fitsfile *fptr,long gsize,long ngroups,long offset,void *buffer,int *status)

{
  LONGLONG *pLVar1;
  int iVar2;
  FITSfile *pFVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  void *__dest;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  long local_68;
  
  if (0 < *status) {
    return *status;
  }
  pFVar3 = fptr->Fptr;
  if (fptr->HDUposition != pFVar3->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar3 = fptr->Fptr;
  }
  iVar2 = pFVar3->curbuf;
  if (iVar2 < 0) {
    ffldrc(fptr,pFVar3->bytepos / 0xb40,0,status);
    pFVar3 = fptr->Fptr;
    iVar2 = pFVar3->curbuf;
  }
  local_68 = pFVar3->bufrecnum[iVar2];
  lVar4 = local_68 * -0xb40 + pFVar3->bytepos;
  sVar10 = 0xb40 - lVar4;
  pcVar6 = pFVar3->iobuffer + lVar4 + iVar2 * 0xb40;
  if (1 < ngroups) {
    lVar4 = ngroups + -1;
    __dest = buffer;
    do {
      sVar7 = gsize;
      if ((long)sVar10 < gsize) {
        sVar7 = sVar10;
      }
      memcpy(__dest,pcVar6,sVar7);
      buffer = (void *)(sVar7 + (long)__dest);
      if ((long)sVar10 < gsize) {
        local_68 = local_68 + 1;
        ffldrc(fptr,local_68,0,status);
        pcVar6 = fptr->Fptr->iobuffer + (long)fptr->Fptr->curbuf * 0xb40;
        memcpy(buffer,pcVar6,gsize - sVar7);
        buffer = (void *)((long)__dest + gsize);
        lVar9 = (gsize - sVar7) + offset;
        pcVar6 = pcVar6 + lVar9;
        sVar10 = 0xb40 - lVar9;
      }
      else {
        pcVar6 = pcVar6 + sVar7 + offset;
        sVar10 = sVar10 - (sVar7 + offset);
      }
      if (sVar10 - 0xb41 < 0xfffffffffffff4c0) {
        if ((long)sVar10 < 1) {
          uVar5 = (0xb40 - sVar10) / 0xb40;
          uVar8 = -sVar10 % 0xb40;
        }
        else {
          uVar5 = -((sVar10 - 1) / 0xb40);
          uVar8 = ((sVar10 / 0xb40) * 0xb40 - sVar10) + 0xb40;
        }
        local_68 = local_68 + uVar5;
        ffldrc(fptr,local_68,0,status);
        sVar10 = 0xb40 - uVar8;
        pcVar6 = fptr->Fptr->iobuffer + uVar8 + (long)fptr->Fptr->curbuf * 0xb40;
      }
      lVar4 = lVar4 + -1;
      __dest = buffer;
    } while (lVar4 != 0);
  }
  sVar7 = gsize;
  if ((long)sVar10 < gsize) {
    sVar7 = sVar10;
  }
  memcpy(buffer,pcVar6,sVar7);
  if ((long)sVar10 < gsize) {
    ffldrc(fptr,local_68 + 1,0,status);
    memcpy((void *)((long)buffer + sVar7),fptr->Fptr->iobuffer + (long)fptr->Fptr->curbuf * 0xb40,
           gsize - sVar7);
  }
  pLVar1 = &fptr->Fptr->bytepos;
  *pLVar1 = *pLVar1 + (ngroups + -1) * offset + gsize * ngroups;
  return *status;
}

Assistant:

int ffgbytoff(fitsfile *fptr, /* I - FITS file pointer                   */
           long gsize,        /* I - size of each group of bytes         */
           long ngroups,      /* I - number of groups to read            */
           long offset,       /* I - size of gap between groups (may be < 0) */
           void *buffer,      /* I - buffer to be filled                 */
           int *status)       /* IO - error status                       */
/*
  get (read) the requested number of bytes from the file, starting at
  the current file position.  This function combines ffmbyt and ffgbyt
  for increased efficiency.
*/
{
    int bcurrent;
    long ii, bufpos, nspace, nread, record;
    char *cptr, *ioptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
    {                              /* so reload the last one that was used */
      ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
    }

    cptr = (char *)buffer;
    bcurrent = (fptr->Fptr)->curbuf;     /* number of the current IO buffer */
    record = (fptr->Fptr)->bufrecnum[bcurrent];  /* zero-indexed record number */
    bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)record * IOBUFLEN)); /* start pos */
    nspace = IOBUFLEN - bufpos;  /* amount of space left in buffer */
    ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;  

    for (ii = 1; ii < ngroups; ii++)  /* read all but the last group */
    {
      /* copy bytes from IO buffer to the user's buffer */
      nread = minvalue(gsize, nspace);
      memcpy(cptr, ioptr, nread);
      cptr += nread;          /* increment buffer pointer */

      if (nread < gsize)        /* entire group did not fit */
      {
        record++;
        ffldrc(fptr, record, REPORT_EOF, status);  /* load next record */
        bcurrent = (fptr->Fptr)->curbuf;
        ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

        nread  = gsize - nread;
        memcpy(cptr, ioptr, nread);
        cptr   += nread;            /* increment buffer pointer */
        ioptr  += (offset + nread); /* increment IO buffer pointer */
        nspace = IOBUFLEN - offset - nread;  /* amount of space left */
      }
      else
      {
        ioptr  += (offset + nread);  /* increment IO bufer pointer */
        nspace -= (offset + nread);
      }

      if (nspace <= 0 || nspace > IOBUFLEN) /* beyond current record? */
      {
        if (nspace <= 0)
        {
          record += ((IOBUFLEN - nspace) / IOBUFLEN); /* new record number */
          bufpos = (-nspace) % IOBUFLEN; /* starting buffer pos */
        }
        else
        {
          record -= ((nspace - 1 ) / IOBUFLEN); /* new record number */
          bufpos = IOBUFLEN - (nspace % IOBUFLEN); /* starting buffer pos */
        }

        ffldrc(fptr, record, REPORT_EOF, status);
        bcurrent = (fptr->Fptr)->curbuf;

        nspace = IOBUFLEN - bufpos;
        ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;
      }
    }

    /* now read the last group */
    nread = minvalue(gsize, nspace);
    memcpy(cptr, ioptr, nread);
    cptr += nread;          /* increment buffer pointer */

    if (nread < gsize)        /* entire group did not fit */
    {
      record++;
      ffldrc(fptr, record, REPORT_EOF, status);  /* load next record */
      bcurrent = (fptr->Fptr)->curbuf;
      ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

      nread  = gsize - nread;
      memcpy(cptr, ioptr, nread);
    }

    (fptr->Fptr)->bytepos = (fptr->Fptr)->bytepos + (ngroups * gsize)
                                  + (ngroups - 1) * offset;
    return(*status);
}